

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::renderTo
          (SingleBindingCase *this,Surface *dst)

{
  GLsizei stride;
  RenderContext *context;
  int iVar1;
  GLuint attribindex;
  GLuint attribindex_00;
  GLint location;
  GLenum GVar2;
  deUint32 err;
  undefined4 extraout_var;
  long offset;
  void *data;
  CallLogWrapper gl;
  CallLogWrapper local_70;
  TextureFormat local_58;
  PixelBufferAccess local_50;
  
  iVar1 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_70,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log);
  attribindex = glu::CallLogWrapper::glGetAttribLocation
                          (&local_70,
                           (((this->super_BindingRenderCase).m_program)->m_program).m_program,
                           "a_position");
  attribindex_00 =
       glu::CallLogWrapper::glGetAttribLocation
                 (&local_70,(((this->super_BindingRenderCase).m_program)->m_program).m_program,
                  "a_color");
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&local_70,(((this->super_BindingRenderCase).m_program)->m_program).m_program
                        ,"u_color");
  local_70.m_enableLog = true;
  glu::CallLogWrapper::glClearColor(&local_70,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&local_70,0x4000);
  glu::CallLogWrapper::glViewport(&local_70,0,0,dst->m_width,dst->m_height);
  glu::CallLogWrapper::glBindVertexArray(&local_70,(this->super_BindingRenderCase).m_vao);
  GVar2 = glu::CallLogWrapper::glGetError(&local_70);
  glu::checkError(GVar2,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x145);
  glu::CallLogWrapper::glUseProgram
            (&local_70,(((this->super_BindingRenderCase).m_program)->m_program).m_program);
  GVar2 = glu::CallLogWrapper::glGetError(&local_70);
  glu::checkError(GVar2,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x148);
  offset = (long)(this->m_spec).bufferOffset;
  stride = (this->m_spec).bufferStride;
  if ((this->m_spec).hasColorAttr == true) {
    glu::CallLogWrapper::glBindVertexBuffer(&local_70,3,this->m_buf,offset,stride);
    glu::CallLogWrapper::glVertexAttribBinding(&local_70,attribindex,3);
    glu::CallLogWrapper::glVertexAttribFormat
              (&local_70,attribindex,4,0x1406,'\0',(this->m_spec).positionAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray(&local_70,attribindex);
    glu::CallLogWrapper::glVertexAttribBinding(&local_70,attribindex_00,3);
    glu::CallLogWrapper::glVertexAttribFormat
              (&local_70,attribindex_00,4,0x1406,'\0',(this->m_spec).colorAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray(&local_70,attribindex_00);
    GVar2 = glu::CallLogWrapper::glGetError(&local_70);
    glu::checkError(GVar2,"set va",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x156);
    glu::CallLogWrapper::glDrawArrays(&local_70,4,0,0x960);
    err = glu::CallLogWrapper::glGetError(&local_70);
    iVar1 = 0x159;
  }
  else {
    glu::CallLogWrapper::glBindVertexBuffer(&local_70,3,this->m_buf,offset,stride);
    glu::CallLogWrapper::glVertexAttribBinding(&local_70,attribindex,3);
    glu::CallLogWrapper::glVertexAttribFormat
              (&local_70,attribindex,4,0x1406,'\0',(this->m_spec).positionAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray(&local_70,attribindex);
    GVar2 = glu::CallLogWrapper::glGetError(&local_70);
    glu::checkError(GVar2,"set va",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x162);
    glu::CallLogWrapper::glUniform4f(&local_70,location,0.0,1.0,0.0,1.0);
    glu::CallLogWrapper::glDrawArrays(&local_70,4,0,0x960);
    err = glu::CallLogWrapper::glGetError(&local_70);
    iVar1 = 0x166;
  }
  glu::checkError(err,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,iVar1);
  glu::CallLogWrapper::glFinish(&local_70);
  glu::CallLogWrapper::glBindVertexArray(&local_70,0);
  glu::CallLogWrapper::glUseProgram(&local_70,0);
  GVar2 = glu::CallLogWrapper::glGetError(&local_70);
  glu::checkError(GVar2,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x16c);
  context = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_58.order = RGBA;
  local_58.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_50,&local_58,dst->m_width,dst->m_height,1,data);
  glu::readPixels(context,0,0,&local_50);
  glu::CallLogWrapper::~CallLogWrapper(&local_70);
  return;
}

Assistant:

void SingleBindingCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int			positionLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int			colorLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	const int			colorUniformLoc	= gl.glGetUniformLocation(m_program->getProgram(), "u_color");

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	if (m_spec.hasColorAttr)
	{
		gl.glBindVertexBuffer(3, m_buf, m_spec.bufferOffset, m_spec.bufferStride);

		gl.glVertexAttribBinding(positionLoc, 3);
		gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, m_spec.positionAttrOffset);
		gl.glEnableVertexAttribArray(positionLoc);

		gl.glVertexAttribBinding(colorLoc, 3);
		gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, m_spec.colorAttrOffset);
		gl.glEnableVertexAttribArray(colorLoc);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "set va");

		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");
	}
	else
	{
		gl.glBindVertexBuffer(3, m_buf, m_spec.bufferOffset, m_spec.bufferStride);
		gl.glVertexAttribBinding(positionLoc, 3);
		gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, m_spec.positionAttrOffset);
		gl.glEnableVertexAttribArray(positionLoc);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "set va");
		gl.glUniform4f(colorUniformLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");
	}

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}